

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

int sock_get_fd(nni_sock *s,uint flag,int *fdp)

{
  uint32_t uVar1;
  nni_pollable *local_38;
  nni_pollable *p;
  int *piStack_28;
  int rv;
  int *fdp_local;
  nni_sock *pnStack_18;
  uint flag_local;
  nni_sock *s_local;
  
  piStack_28 = fdp;
  fdp_local._4_4_ = flag;
  pnStack_18 = s;
  uVar1 = nni_sock_flags(s);
  if ((flag & uVar1) == 0) {
    s_local._4_4_ = 9;
  }
  else {
    if (fdp_local._4_4_ == 2) {
      p._4_4_ = nni_msgq_get_sendable(pnStack_18->s_uwq,&local_38);
    }
    else {
      p._4_4_ = nni_msgq_get_recvable(pnStack_18->s_urq,&local_38);
    }
    if (p._4_4_ == 0) {
      p._4_4_ = nni_pollable_getfd(local_38,piStack_28);
    }
    s_local._4_4_ = p._4_4_;
  }
  return s_local._4_4_;
}

Assistant:

static int
sock_get_fd(nni_sock *s, unsigned flag, int *fdp)
{
	int           rv;
	nni_pollable *p;

	if ((flag & nni_sock_flags(s)) == 0) {
		return (NNG_ENOTSUP);
	}

	if (flag == NNI_PROTO_FLAG_SND) {
		rv = nni_msgq_get_sendable(s->s_uwq, &p);
	} else {
		rv = nni_msgq_get_recvable(s->s_urq, &p);
	}

	if (rv == 0) {
		rv = nni_pollable_getfd(p, fdp);
	}

	return (rv);
}